

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
* __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvarianceTestInstance::genTessLevelCases
          (vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
           *__return_storage_ptr__,InvarianceTestInstance *this)

{
  int j;
  int i;
  int iVar1;
  long lVar2;
  float fVar3;
  LevelCase LStack_78;
  TessLevels levels;
  Random rnd;
  
  (__return_storage_ptr__->
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar2 = 0; lVar2 != 0xd8; lVar2 = lVar2 + 0x18) {
    LevelCase::LevelCase
              (&LStack_78,
               (TessLevels *)((long)genTessLevelCases::basicTessLevelCases[0].inner + lVar2));
    std::
    vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
    ::push_back(__return_storage_ptr__,&LStack_78);
    std::_Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ::~_Vector_base((_Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                     *)&LStack_78);
  }
  deRandom_init(&rnd.m_rnd,0x7b);
  for (iVar1 = 0; iVar1 != 10; iVar1 = iVar1 + 1) {
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      fVar3 = deRandom_getFloat(&rnd.m_rnd);
      levels.inner[lVar2] = fVar3 * 15.0 + 1.0;
    }
    for (lVar2 = 2; lVar2 != 6; lVar2 = lVar2 + 1) {
      fVar3 = deRandom_getFloat(&rnd.m_rnd);
      levels.inner[lVar2] = fVar3 * 15.0 + 1.0;
    }
    LevelCase::LevelCase(&LStack_78,&levels);
    std::
    vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
    ::push_back(__return_storage_ptr__,&LStack_78);
    std::_Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ::~_Vector_base((_Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                     *)&LStack_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<LevelCase> InvarianceTestInstance::genTessLevelCases (void) const
{
	static const TessLevels basicTessLevelCases[] =
	{
		{ { 1.0f,	1.0f	},	{ 1.0f,		1.0f,	1.0f,	1.0f	} },
		{ { 63.0f,	24.0f	},	{ 15.0f,	42.0f,	10.0f,	12.0f	} },
		{ { 3.0f,	2.0f	},	{ 6.0f,		8.0f,	7.0f,	9.0f	} },
		{ { 4.0f,	6.0f	},	{ 2.0f,		3.0f,	1.0f,	4.0f	} },
		{ { 2.0f,	2.0f	},	{ 6.0f,		8.0f,	7.0f,	9.0f	} },
		{ { 5.0f,	6.0f	},	{ 1.0f,		1.0f,	1.0f,	1.0f	} },
		{ { 1.0f,	6.0f	},	{ 2.0f,		3.0f,	1.0f,	4.0f	} },
		{ { 5.0f,	1.0f	},	{ 2.0f,		3.0f,	1.0f,	4.0f	} },
		{ { 5.2f,	1.6f	},	{ 2.9f,		3.4f,	1.5f,	4.1f	} }
	};

	std::vector<LevelCase> result;
	for (int i = 0; i < DE_LENGTH_OF_ARRAY(basicTessLevelCases); ++i)
		result.push_back(LevelCase(basicTessLevelCases[i]));

	{
		de::Random rnd(123);
		for (int i = 0; i < 10; ++i)
		{
			TessLevels levels;
			for (int j = 0; j < DE_LENGTH_OF_ARRAY(levels.inner); ++j)
				levels.inner[j] = rnd.getFloat(1.0f, 16.0f);
			for (int j = 0; j < DE_LENGTH_OF_ARRAY(levels.outer); ++j)
				levels.outer[j] = rnd.getFloat(1.0f, 16.0f);
			result.push_back(LevelCase(levels));
		}
	}

	return result;
}